

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O1

int mg_raw_transport_recv(mg_transport *transport,char *buf,size_t len)

{
  int sock;
  bool bVar1;
  ssize_t sVar2;
  ulong uVar3;
  
  sock = *(int *)&transport[1].send;
  uVar3 = 0;
  do {
    if (len <= uVar3) {
      return 0;
    }
    sVar2 = mg_socket_receive(sock,buf + uVar3,(int)len - (int)uVar3);
    if (sVar2 == -1) {
      perror("mg_raw_transport_recv");
LAB_00108f70:
      bVar1 = false;
    }
    else {
      if (sVar2 == 0) {
        mg_raw_transport_recv_cold_1();
        goto LAB_00108f70;
      }
      uVar3 = uVar3 + sVar2;
      bVar1 = true;
    }
    if (!bVar1) {
      return -1;
    }
  } while( true );
}

Assistant:

int mg_raw_transport_recv(struct mg_transport *transport, char *buf,
                          size_t len) {
  int sockfd = ((mg_raw_transport *)transport)->sockfd;
  size_t total_received = 0;
  while (total_received < len) {
    ssize_t received_now =
        mg_socket_receive(sockfd, buf + total_received, len - total_received);
    if (received_now == 0) {
      // Server closed the connection.
      fprintf(stderr, "mg_raw_transport_recv: connection closed by server\n");
      return -1;
    }
    if (received_now == -1) {
      perror("mg_raw_transport_recv");
      return -1;
    }
    total_received += (size_t)received_now;
  }
  return 0;
}